

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O2

void test_contains_all(void)

{
  _Bool _Var1;
  bitset_t *b1;
  bitset_t *b2;
  int i;
  ulong i_00;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (i_00 = 0; i_00 != 1000; i_00 = i_00 + 1) {
    bitset_set(b1,i_00);
    if ((i_00 & 1) == 0) {
      bitset_set(b2,i_00);
    }
  }
  _Var1 = bitset_contains_all(b1,b2);
  _assert_true((ulong)_Var1,"bitset_contains_all(superset, subset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x118);
  _Var1 = bitset_contains_all(b2,b1);
  _assert_true((ulong)!_Var1,"!bitset_contains_all(subset, superset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x119);
  bitset_set(b2,0x3e9);
  _Var1 = bitset_contains_all(b1,b2);
  _assert_true((ulong)!_Var1,"!bitset_contains_all(superset, subset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x11d);
  _Var1 = bitset_contains_all(b2,b1);
  _assert_true((ulong)!_Var1,"!bitset_contains_all(subset, superset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x11e);
  bitset_free(b1);
  bitset_free(b2);
  return;
}

Assistant:

DEFINE_TEST(test_contains_all) {
    bitset_t *superset = bitset_create();
    bitset_t *subset = bitset_create();

    for (int i = 0; i < 1000; i++) {
        bitset_set(superset, i);
        if (i % 2 == 0) bitset_set(subset, i);
    }

    assert_true(bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_set(subset, 1001);

    assert_true(!bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_free(superset);
    bitset_free(subset);
}